

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::AddHelpOption(OptionParser *this)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:93:48)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:93:48)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  AddOption(this,"help","Print this help message",(NullCallback *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return;
}

Assistant:

void OptionParser::AddHelpOption() {
  AddOption("help", "Print this help message", [this]() {
    PrintHelp();
    exit(0);
  });
}